

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
glcts::(anonymous_namespace)::UniformBlockTypes::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 310 es                      \nin vec4 position;                    \nuniform SimpleBlock {                \n   mediump mat3x2 a;                         \n   mediump mat4 b;                           \n   vec4 c;                           \n};                                   \nuniform NotSoSimpleBlockk {          \n   ivec2 a[4];                       \n   mediump mat3 b[2];                        \n   mediump mat2 c;                           \n} d;                                         \nvoid main(void)                                               \n{                                                             \n    mediump float tmp;                                        \n    tmp =  a[0][1] * b[1][2] * c.x;                           \n    tmp = tmp + float(d.a[2].y) + d.b[0][1][1] + d.c[1][1];   \n    gl_Position = position * tmp;                             \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 310 es                      \n"
			   "in vec4 position;                    \n"
			   ""
			   "uniform SimpleBlock {                \n"
			   "   mediump mat3x2 a;                         \n"
			   "   mediump mat4 b;                           \n"
			   "   vec4 c;                           \n"
			   "};                                   \n"
			   ""
			   "uniform NotSoSimpleBlockk {          \n"
			   "   ivec2 a[4];                       \n"
			   "   mediump mat3 b[2];                        \n"
			   "   mediump mat2 c;                           \n"
			   "} d;                                         \n"
			   ""
			   "void main(void)                                               \n"
			   "{                                                             \n"
			   "    mediump float tmp;                                        \n"
			   "    tmp =  a[0][1] * b[1][2] * c.x;                           \n"
			   "    tmp = tmp + float(d.a[2].y) + d.b[0][1][1] + d.c[1][1];   \n"
			   "    gl_Position = position * tmp;                             \n"
			   "}";
	}